

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::updateSampler(RemotelyControlledSampler *this)

{
  element_type *peVar1;
  Counter *pCVar2;
  int iVar3;
  undefined1 local_90 [24];
  double local_78;
  undefined **local_70;
  int16_t local_68;
  undefined **local_60;
  double local_58;
  double dStack_50;
  pointer local_48;
  pointer pOStack_40;
  pointer local_38;
  double dStack_30;
  _PerOperationSamplingStrategies__isset local_28;
  _SamplingStrategyResponse__isset local_20;
  
  peVar1 = (this->_manager).
           super___shared_ptr<jaegertracing::sampling_manager::thrift::SamplingManagerIf,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("_manager",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/samplers/RemotelyControlledSampler.cpp"
                  ,0x91,"void jaegertracing::samplers::RemotelyControlledSampler::updateSampler()");
  }
  local_90._0_8_ = &PTR__SamplingStrategyResponse_00274668;
  local_90._8_4_ = PROBABILISTIC;
  local_90._16_8_ = &PTR__ProbabilisticSamplingStrategy_002744c8;
  local_78 = 0.0;
  local_70 = &PTR__RateLimitingSamplingStrategy_00274530;
  local_68 = 0;
  local_60 = &PTR__PerOperationSamplingStrategies_00274600;
  local_20 = (_SamplingStrategyResponse__isset)0x0;
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_48 = (pointer)0x0;
  pOStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  dStack_30 = 0.0;
  local_28 = (_PerOperationSamplingStrategies__isset)0x0;
  (*peVar1->_vptr_SamplingManagerIf[2])(peVar1,local_90,&this->_serviceName);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar3 == 0) {
    pCVar2 = (this->_metrics->_samplerRetrieved)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
    (*pCVar2->_vptr_Counter[2])(pCVar2,1);
    if (((byte)local_20 & 4) == 0) {
      updateRateLimitingOrProbabilisticSampler(this,(SamplingStrategyResponse *)local_90);
    }
    else {
      updateAdaptiveSampler(this,(PerOperationSamplingStrategies *)&local_60);
    }
    pCVar2 = (this->_metrics->_samplerUpdated)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
    (*pCVar2->_vptr_Counter[2])(pCVar2,1);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
              ((SamplingStrategyResponse *)local_90);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void RemotelyControlledSampler::updateSampler()
{
    assert(_manager);
    sampling_manager::thrift::SamplingStrategyResponse response;
    try {
        assert(_manager);
        _manager->getSamplingStrategy(response, _serviceName);
    } catch (const std::exception& ex) {
        _metrics.samplerQueryFailure().inc(1);
        return;
    } catch (...) {
        _metrics.samplerQueryFailure().inc(1);
        return;
    }

    std::lock_guard<std::mutex> lock(_mutex);
    _metrics.samplerRetrieved().inc(1);

    if (response.__isset.operationSampling) {
        updateAdaptiveSampler(response.operationSampling);
    }
    else {
        try {
            updateRateLimitingOrProbabilisticSampler(response);
        } catch (const std::exception& ex) {
            _metrics.samplerUpdateFailure().inc(1);
            return;
        } catch (...) {
            _metrics.samplerUpdateFailure().inc(1);
            return;
        }
    }
    _metrics.samplerUpdated().inc(1);
}